

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

LocalFederateId __thiscall
helics::CommonCore::registerFederate(CommonCore *this,string_view name,CoreFederateInfo *info)

{
  string_view name_00;
  string_view message;
  string_view message_00;
  string_view message_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view name_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view message_08;
  bool bVar1;
  FederateStates FVar2;
  undefined1 uVar3;
  IterationResult IVar4;
  BrokerState BVar5;
  int iVar6;
  undefined8 uVar7;
  size_type sVar8;
  size_type sVar9;
  unsigned_long *puVar10;
  reference ppVar11;
  string *this_00;
  long in_RCX;
  __node_base_ptr in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RSI;
  CommonCore *in_RDI;
  optional<unsigned_long> oVar12;
  IterationResult valid;
  pair<int,_int> *prop;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  ActionMessage reg;
  optional<unsigned_long> fedid;
  handle feds;
  bool newFed;
  bool checkProperties;
  FederateState *fed;
  string nname;
  size_type iloc;
  LocalFederateId local_id;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  BrokerBase *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  FederateState *in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 uVar13;
  action_t in_stack_fffffffffffff8ec;
  undefined4 uVar14;
  ActionMessage *in_stack_fffffffffffff8f0;
  char *pcVar15;
  undefined7 in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff8ff;
  int in_stack_fffffffffffff900;
  undefined2 in_stack_fffffffffffff904;
  undefined1 in_stack_fffffffffffff906;
  undefined1 in_stack_fffffffffffff907;
  FederateState *in_stack_fffffffffffff908;
  FederateState *in_stack_fffffffffffff910;
  CoreFederateInfo *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff930;
  CoreFederateInfo *in_stack_fffffffffffff9a8;
  FederateState *in_stack_fffffffffffff9b0;
  char local_611 [60];
  undefined1 in_stack_fffffffffffffa2b;
  int in_stack_fffffffffffffa2c;
  BrokerBase *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  undefined8 in_stack_fffffffffffffa48;
  GlobalFederateId federateID;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_5a8;
  long local_5a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_598;
  __node_base_ptr p_Stack_590;
  uint16_t local_568;
  undefined2 in_stack_fffffffffffffab0;
  int16_t in_stack_fffffffffffffab2;
  int32_t in_stack_fffffffffffffab4;
  Time in_stack_fffffffffffffab8;
  LocalFederateId in_stack_fffffffffffffac4;
  pointer in_stack_fffffffffffffb30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb38;
  string_view in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb70;
  bool in_stack_fffffffffffffb77;
  char *in_stack_fffffffffffffb78;
  __sv_type local_458;
  undefined1 local_441;
  char *local_440;
  size_t local_438;
  undefined1 local_430 [32];
  __sv_type local_410;
  allocator<char> local_3f9 [33];
  LocalFederateId local_3d8;
  allocator<char> local_3d1 [40];
  allocator<char> local_3a9 [33];
  _Storage<unsigned_long,_true> local_388;
  undefined1 local_380;
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  local_368;
  byte local_34a;
  byte local_349;
  FederateState *local_348;
  __sv_type local_340;
  char *local_330;
  undefined8 local_328;
  undefined1 local_320 [32];
  __sv_type local_300;
  __sv_type local_2f0;
  undefined4 local_2e0;
  GlobalFederateId local_2dc [5];
  __sv_type local_2c8;
  __sv_type local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  __node_base_ptr local_2a0;
  char *local_288;
  size_t local_280;
  __pthread_internal_list local_278 [4];
  undefined1 local_238 [32];
  undefined1 local_218 [72];
  __sv_type local_1d0;
  long local_1c0;
  undefined1 local_1b0 [20];
  LocalFederateId local_19c;
  undefined1 local_198 [24];
  undefined1 local_180 [32];
  char *local_160;
  pointer pAStack_158;
  pointer local_150;
  undefined1 local_148 [16];
  undefined8 local_138;
  pointer local_130;
  char *local_128;
  undefined8 uStack_120;
  undefined1 *local_118;
  char *local_110;
  undefined8 uStack_108;
  undefined1 *local_100;
  undefined1 local_f8 [16];
  undefined8 local_e8 [2];
  char *local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [56];
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  pointer local_30;
  undefined8 *local_28;
  _Base_ptr local_20;
  _Base_ptr local_18;
  pointer local_10;
  undefined1 *local_8;
  
  federateID.gid = (BaseType)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  local_1c0 = in_RCX;
  local_1b0._0_8_ = in_RSI;
  local_1b0._8_8_ = in_RDX;
  bVar1 = waitCoreRegistration
                    ((CommonCore *)
                     CONCAT44(in_stack_fffffffffffffab4,
                              CONCAT22(in_stack_fffffffffffffab2,in_stack_fffffffffffffab0)));
  if (!bVar1) {
    BVar5 = BrokerBase::getBrokerState((BrokerBase *)0x535395);
    if ((BVar5 == ERRORED) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x5353b7), !bVar1)) {
      uVar7 = __cxa_allocate_exception(0x28);
      local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      message._M_len._4_4_ = in_stack_fffffffffffff8ec;
      message._M_len._0_4_ = in_stack_fffffffffffff8e8;
      message._M_str = (char *)in_stack_fffffffffffff8f0;
      RegistrationFailure::RegistrationFailure
                ((RegistrationFailure *)in_stack_fffffffffffff8e0,message);
      __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
    }
    uVar7 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e0,
               (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    message_00._M_len._4_4_ = in_stack_fffffffffffff8ec;
    message_00._M_len._0_4_ = in_stack_fffffffffffff8e8;
    message_00._M_str = (char *)in_stack_fffffffffffff8f0;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_00);
    __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  BVar5 = BrokerBase::getBrokerState((BrokerBase *)0x53549e);
  if ((INITIALIZING < BVar5) && (((in_RDI->super_BrokerBase).dynamicFederation & 1U) == 0)) {
    uVar7 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e0,
               (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    message_01._M_len._4_4_ = in_stack_fffffffffffff8ec;
    message_01._M_len._0_4_ = in_stack_fffffffffffff8e8;
    message_01._M_str = (char *)in_stack_fffffffffffff8f0;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_01);
    __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  local_218._32_8_ =
       std::basic_string_view<char,_std::char_traits<char>_>::find
                 ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8f0,
                  (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                  (size_type)in_stack_fffffffffffff8e0);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8e0);
  if (local_218._32_8_ != 0xffffffffffffffff) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e0,
               (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    local_288 = "rename:{}";
    local_280 = 9;
    local_c8._24_8_ = local_278;
    local_c8._8_8_ = "rename:{}";
    local_c8._16_8_ = 9;
    local_c8._0_8_ = local_1b0;
    local_d8 = "rename:{}";
    uStack_d0 = (__pthread_internal_list *)0x9;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffff8e0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    local_38 = local_e8;
    local_40 = local_f8;
    local_e8[0] = 0xd;
    args.field_1.values_ = in_stack_fffffffffffffb38.values_;
    args.desc_ = (unsigned_long_long)in_stack_fffffffffffffb30;
    local_e8[1] = local_40;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb40,args);
    local_278[2] = (__pthread_internal_list)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff8d0);
    in_stack_fffffffffffff8c8 = 0;
    (*(in_RDI->super_Core)._vptr_Core[0x5e])
              (local_238,in_RDI,local_278[3].__prev,local_278[3].__next,local_278[2].__prev,
               local_278[2].__next);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff918);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d0);
    local_2a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._0_8_;
    local_2a0 = (__node_base_ptr)local_1b0._8_8_;
    local_2b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d0);
    __x._M_len._7_1_ = in_stack_fffffffffffff8ff;
    __x._M_len._0_7_ = in_stack_fffffffffffff8f8;
    __x._M_str._0_4_ = in_stack_fffffffffffff900;
    __x._M_str._4_2_ = in_stack_fffffffffffff904;
    __x._M_str._6_1_ = in_stack_fffffffffffff906;
    __x._M_str._7_1_ = in_stack_fffffffffffff907;
    __y._M_len._4_4_ = in_stack_fffffffffffff8ec;
    __y._M_len._0_4_ = in_stack_fffffffffffff8e8;
    __y._M_str = (char *)in_stack_fffffffffffff8f0;
    bVar1 = std::operator==(__x,__y);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      __str._M_len._7_1_ = in_stack_fffffffffffff8ff;
      __str._M_len._0_7_ = in_stack_fffffffffffff8f8;
      __str._M_str._0_4_ = in_stack_fffffffffffff900;
      __str._M_str._4_2_ = in_stack_fffffffffffff904;
      __str._M_str._6_1_ = in_stack_fffffffffffff906;
      __str._M_str._7_1_ = in_stack_fffffffffffff907;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff8f0,
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         (size_type)in_stack_fffffffffffff8e0,__str);
      if ((iVar6 != 0) &&
         (sVar8 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8f0,
                             (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                             (size_type)in_stack_fffffffffffff8e0), sVar8 != 0xffffffffffffffff)) {
        uVar7 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e0,
                   (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        message_02._M_len._4_4_ = in_stack_fffffffffffff8ec;
        message_02._M_len._0_4_ = in_stack_fffffffffffff8e8;
        message_02._M_str = (char *)in_stack_fffffffffffff8f0;
        RegistrationFailure::RegistrationFailure
                  ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_02);
        __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
      }
      in_stack_fffffffffffff9a8 = (CoreFederateInfo *)&in_RDI->super_BrokerBase;
      local_2e0 = 0;
      GlobalFederateId::GlobalFederateId(local_2dc,(GlobalBrokerId)0x0);
      getIdentifier_abi_cxx11_(in_RDI);
      local_2f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      local_330 = "generated name for fed {}->{}";
      local_328 = 0x1d;
      local_48 = local_320;
      local_58 = "generated name for fed {}->{}";
      uStack_50 = 0x1d;
      local_60 = local_1b0;
      local_68 = local_218;
      local_a8._48_8_ = "generated name for fed {}->{}";
      uStack_70._0_1_ = (__atomic_base<bool>)0x1d;
      uStack_70._1_7_ = 0;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff8e0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff8e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      local_8 = local_a8 + 0x20;
      local_10 = (pointer)local_a8;
      local_a8._32_8_ = (pointer)0xdd;
      args_00.field_1.values_ = in_stack_fffffffffffffb38.values_;
      args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffb30;
      local_a8._40_8_ = local_10;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb40,args_00);
      local_300 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      in_stack_fffffffffffff8c8 = (undefined4)local_300._M_len;
      in_stack_fffffffffffff8cc = local_300._M_len._4_4_;
      name_01._M_str._0_4_ = in_stack_fffffffffffffa40;
      name_01._M_len = in_stack_fffffffffffffa38;
      name_01._M_str._4_4_ = in_stack_fffffffffffffa44;
      message_08._M_len._7_1_ = in_stack_fffffffffffffb77;
      message_08._M_len._0_1_ = (FederateStates)in_stack_fffffffffffffb70;
      message_08._M_len._1_1_ = SUB71(in_stack_fffffffffffffb70,1);
      message_08._M_len._2_1_ = SUB71(in_stack_fffffffffffffb70,2);
      message_08._M_len._3_1_ = SUB71(in_stack_fffffffffffffb70,3);
      message_08._M_len._4_1_ = SUB71(in_stack_fffffffffffffb70,4);
      message_08._M_len._5_1_ = SUB71(in_stack_fffffffffffffb70,5);
      message_08._M_len._6_1_ = SUB71(in_stack_fffffffffffffb70,6);
      message_08._M_str = in_stack_fffffffffffffb78;
      in_stack_fffffffffffff8d0 = (BrokerBase *)local_300._M_str;
      BrokerBase::sendToLogger
                (in_stack_fffffffffffffa30,federateID,in_stack_fffffffffffffa2c,name_01,message_08,
                 (bool)in_stack_fffffffffffffa2b);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8d0);
      local_340 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      local_1b0._0_8_ = local_340._M_len;
      local_1b0._8_8_ = local_340._M_str;
    }
  }
  local_348 = (FederateState *)0x0;
  local_349 = 0;
  local_34a = 1;
  LocalFederateId::LocalFederateId(&local_19c);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock((shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
          *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  gmlc::libguarded::
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::operator->(&local_368);
  sVar9 = gmlc::containers::
          MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x535b22);
  if ((in_RDI->super_BrokerBase).maxFederateCount <= (int)sVar9) {
    uVar7 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e0,
               (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    message_03._M_len._4_4_ = in_stack_fffffffffffff8ec;
    message_03._M_len._0_4_ = in_stack_fffffffffffff8e8;
    message_03._M_str = (char *)in_stack_fffffffffffff8f0;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_03);
    __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::operator->(&local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff910,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff908,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffff907,
                      CONCAT16(in_stack_fffffffffffff906,
                               CONCAT24(in_stack_fffffffffffff904,in_stack_fffffffffffff900))));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff910,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff908,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffff907,
                      CONCAT16(in_stack_fffffffffffff906,
                               CONCAT24(in_stack_fffffffffffff904,in_stack_fffffffffffff900))));
  oVar12 = gmlc::containers::MappedPointerVector<helics::FederateState,std::__cxx11::string>::
           insert<std::__cxx11::string,helics::CoreFederateInfo_const&>
                     (in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                      in_stack_fffffffffffff918);
  local_388._M_value =
       oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_380 = oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d0);
  std::allocator<char>::~allocator(local_3d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d0);
  std::allocator<char>::~allocator(local_3a9);
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x535ccf);
  if (bVar1) {
    puVar10 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x535ced);
    LocalFederateId::LocalFederateId(&local_3d8,(BaseType)*puVar10);
    local_19c.fid = local_3d8.fid;
    gmlc::libguarded::
    lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::operator*(&local_368);
    std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x535d2c);
    local_348 = gmlc::containers::
                MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[]((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffff8e0,
                             CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  }
  else {
    if (((in_RDI->super_BrokerBase).dynamicFederation & 1U) == 0) {
      uVar7 = __cxa_allocate_exception(0x28);
      local_150 = (pointer)&stack0xfffffffffffffb88;
      local_160 = "duplicate names {} detected: multiple federates with the same name";
      pAStack_158 = (pointer)0x42;
      local_180._24_8_ = local_1b0;
      local_180._8_8_ = "duplicate names {} detected: multiple federates with the same name";
      local_180._16_8_ = 0x42;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff8e0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      local_18 = (_Base_ptr)(local_198 + 0x10);
      local_20 = (_Base_ptr)local_198;
      local_198._16_8_ = (__pthread_internal_list *)0xd;
      args_02.field_1.values_ = in_stack_fffffffffffffb38.values_;
      args_02.desc_ = (unsigned_long_long)in_stack_fffffffffffffb30;
      local_180._0_8_ = local_20;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb40,args_02);
      local_458 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      message_05._M_len._4_4_ = in_stack_fffffffffffff8ec;
      message_05._M_len._0_4_ = in_stack_fffffffffffff8e8;
      message_05._M_str = (char *)in_stack_fffffffffffff8f0;
      RegistrationFailure::RegistrationFailure
                ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_05);
      __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
    }
    gmlc::libguarded::
    lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::operator->(&local_368);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff910,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff908,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff907,
                        CONCAT16(in_stack_fffffffffffff906,
                                 CONCAT24(in_stack_fffffffffffff904,in_stack_fffffffffffff900))));
    local_348 = gmlc::containers::
                MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::find((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                       &in_stack_fffffffffffff8e0->name);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d0);
    std::allocator<char>::~allocator(local_3f9);
    local_19c.fid = (local_348->local_id).fid;
    bVar1 = FederateState::getOptionFlag
                      (in_stack_fffffffffffff908,
                       CONCAT13(in_stack_fffffffffffff907,
                                CONCAT12(in_stack_fffffffffffff906,in_stack_fffffffffffff904)));
    if ((!bVar1) || (FVar2 = FederateState::getState((FederateState *)0x535eb6), FVar2 != FINISHED))
    {
      local_441 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      local_440 = "duplicate names {} detected: multiple federates with the same name";
      local_438 = 0x42;
      local_100 = local_430;
      local_110 = "duplicate names {} detected: multiple federates with the same name";
      uStack_108 = 0x42;
      local_118 = local_1b0;
      local_128 = "duplicate names {} detected: multiple federates with the same name";
      uStack_120._0_1_ = (condition_variable)0x42;
      uStack_120._1_7_ = 0;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff8e0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      local_28 = &local_138;
      local_30 = (pointer)local_148;
      local_138 = (pointer)0xd;
      args_01.field_1.values_ = in_stack_fffffffffffffb38.values_;
      args_01.desc_ = (unsigned_long_long)in_stack_fffffffffffffb30;
      local_130 = local_30;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb40,args_01);
      local_410 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
      message_04._M_len._4_4_ = in_stack_fffffffffffff8ec;
      message_04._M_len._0_4_ = in_stack_fffffffffffff8e8;
      message_04._M_str = (char *)in_stack_fffffffffffff8f0;
      RegistrationFailure::RegistrationFailure
                ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_04);
      local_441 = 0;
      __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
    }
    local_34a = 0;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::operator->(&local_368);
  sVar9 = gmlc::containers::
          MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x53629b);
  if ((sVar9 == 1) && ((local_34a & 1) != 0)) {
    local_349 = 1;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                  *)0x5362cc);
  if (local_348 == (FederateState *)0x0) {
    uVar7 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e0,
               (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    message_06._M_len._4_4_ = in_stack_fffffffffffff8ec;
    message_06._M_len._0_4_ = in_stack_fffffffffffff8e8;
    message_06._M_str = (char *)in_stack_fffffffffffff8f0;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffff8e0,message_06);
    __cxa_throw(uVar7,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  if ((local_34a & 1) == 0) {
    FederateState::reset(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  }
  else {
    in_stack_fffffffffffff910 = (FederateState *)&stack0xfffffffffffffb40;
    in_stack_fffffffffffff908 = local_348;
    std::
    function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<helics::CommonCore::registerFederate(std::basic_string_view<char,std::char_traits<char>>,helics::CoreFederateInfo_const&)::__0,void>
              ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)in_stack_fffffffffffff8e0,
               (anon_class_8_1_8991fb9c *)
               CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    FederateState::setLogger
              (in_stack_fffffffffffff910,
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)in_stack_fffffffffffff908);
    CLI::std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)0x5363a6);
    (local_348->local_id).fid = local_19c.fid;
    FederateState::setParent(local_348,in_RDI);
    if (((in_RDI->super_BrokerBase).enable_profiling & 1U) != 0) {
      FederateState::setOptionFlag
                (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,
                 SUB41((uint)in_stack_fffffffffffff8d8 >> 0x18,0));
    }
  }
  ActionMessage::ActionMessage(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
  local_598 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._0_8_;
  p_Stack_590 = (__node_base_ptr)local_1b0._8_8_;
  name_00._M_len._4_4_ = in_stack_fffffffffffff8cc;
  name_00._M_len._0_4_ = in_stack_fffffffffffff8c8;
  name_00._M_str = (char *)in_stack_fffffffffffff8d0;
  ActionMessage::name((ActionMessage *)0x53647d,name_00);
  if ((((in_RDI->super_BrokerBase).observer & 1U) != 0) ||
     (in_stack_fffffffffffff907 =
           FederateState::getOptionFlag
                     (in_stack_fffffffffffff908,
                      CONCAT13(in_stack_fffffffffffff907,
                               CONCAT12(in_stack_fffffffffffff906,in_stack_fffffffffffff904))),
     (bool)in_stack_fffffffffffff907)) {
    setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
              ((ActionMessage *)&stack0xfffffffffffffa80,observer_flag);
  }
  uVar3 = FederateState::getOptionFlag
                    (in_stack_fffffffffffff908,
                     CONCAT13(in_stack_fffffffffffff907,
                              CONCAT12(in_stack_fffffffffffff906,in_stack_fffffffffffff904)));
  if ((bool)uVar3) {
    setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
              ((ActionMessage *)&stack0xfffffffffffffa80,reentrant_flag);
  }
  if (0 < local_348->indexGroup) {
    local_568 = (uint16_t)local_348->indexGroup;
  }
  BrokerBase::addActionMessage
            (in_stack_fffffffffffff8d0,
             (ActionMessage *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  if ((local_349 & 1) != 0) {
    local_5a0 = local_1c0 + 0x18;
    local_5a8._M_current =
         (pair<int,_int> *)
         CLI::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    CLI::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_fffffffffffff8d0,
                              (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar11 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator*(&local_5a8);
      in_stack_fffffffffffff900 = ppVar11->first;
      if ((in_stack_fffffffffffff900 - 0x10fU < 2) || (in_stack_fffffffffffff900 == 0x112)) {
        setIntegerProperty((CommonCore *)in_stack_fffffffffffffab8.internalTimeCode,
                           in_stack_fffffffffffffac4,in_stack_fffffffffffffab4,
                           in_stack_fffffffffffffab2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_5a8);
    }
  }
  IVar4 = FederateState::waitSetup
                    ((FederateState *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8))
  ;
  if (IVar4 != NEXT_STEP) {
    uVar7 = __cxa_allocate_exception(0x28);
    uVar13 = (undefined4)uVar7;
    uVar14 = (undefined4)((ulong)uVar7 >> 0x20);
    pcVar15 = local_611;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff907,
                        CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffff904,in_stack_fffffffffffff900)
                                )));
    this_00 = FederateState::lastErrorString_abi_cxx11_(local_348);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d0);
    message_07._M_len._4_4_ = uVar14;
    message_07._M_len._0_4_ = uVar13;
    message_07._M_str = pcVar15;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_00,message_07);
    __cxa_throw(CONCAT44(uVar14,uVar13),&RegistrationFailure::typeinfo,
                RegistrationFailure::~RegistrationFailure);
  }
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d0);
  return (LocalFederateId)local_19c.fid;
}

Assistant:

LocalFederateId CommonCore::registerFederate(std::string_view name, const CoreFederateInfo& info)
{
    if (!waitCoreRegistration()) {
        if (getBrokerState() == BrokerState::ERRORED) {
            if (!lastErrorString.empty()) {
                throw(RegistrationFailure(lastErrorString));
            }
        }
        throw(RegistrationFailure(
            "core is unable to register and has timed out, federate cannot be registered"));
    }
    if (getBrokerState() >= BrokerState::OPERATING) {
        if (!dynamicFederation) {
            throw(RegistrationFailure("Core has already moved to operating state"));
        }
    }
    auto iloc = name.find("${");
    std::string nname;
    if (iloc != std::string_view::npos) {
        /** this will block*/
        nname = query("root",
                      fmt::format("rename:{}", name),
                      HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        if (name != nname) {
            if (name.compare(0, iloc, nname) != 0 && nname.find("error") != std::string::npos) {
                throw(RegistrationFailure(
                    "automatic naming resulting in failure, may not be supported by broker"));
            }
            sendToLogger(parent_broker_id,
                         HELICS_LOG_LEVEL_SUMMARY,
                         getIdentifier(),
                         fmt::format("generated name for fed {}->{}", name, nname));
            name = nname;
        }
    }
    FederateState* fed = nullptr;
    bool checkProperties{false};
    bool newFed{true};
    LocalFederateId local_id;
    {
        auto feds = federates.lock();
        if (static_cast<decltype(maxFederateCount)>(feds->size()) >= maxFederateCount) {
            throw(RegistrationFailure("maximum number of federates in the core has been reached"));
        }

        auto fedid = feds->insert(std::string(name), std::string(name), info);
        if (fedid) {
            local_id = LocalFederateId(static_cast<int32_t>(*fedid));
            fed = (*feds)[*fedid];
        } else {
            if (dynamicFederation) {
                fed = feds->find(std::string(name));
                local_id = fed->local_id;
                if (!fed->getOptionFlag(HELICS_FLAG_REENTRANT) ||
                    fed->getState() != FederateStates::FINISHED) {
                    throw(RegistrationFailure(fmt::format(
                        "duplicate names {} detected: multiple federates with the same name",
                        name)));
                }
                newFed = false;
            } else {
                throw(RegistrationFailure(fmt::format(
                    "duplicate names {} detected: multiple federates with the same name", name)));
            }
        }

        if (feds->size() == 1 && newFed) {
            checkProperties = true;
        }
    }
    if (fed == nullptr) {
        throw(RegistrationFailure("unknown allocation error occurred"));
    }
    if (newFed) {
        // setting up the Logger
        // auto ptr = fed.get();
        // if we are using the Logger, log all messages coming from the federates so they can
        // control the level*/
        fed->setLogger([this](int level, std::string_view ident, std::string_view message) {
            sendToLogger(parent_broker_id, LogLevels::FED + level, ident, message);
        });

        fed->local_id = local_id;
        fed->setParent(this);
        if (enable_profiling) {
            fed->setOptionFlag(defs::PROFILING, true);
        }
    } else {
        fed->reset(info);
    }
    ActionMessage reg(CMD_REG_FED);
    reg.name(name);
    if (observer || fed->getOptionFlag(HELICS_FLAG_OBSERVER)) {
        setActionFlag(reg, observer_flag);
    }
    if (fed->getOptionFlag(HELICS_FLAG_REENTRANT)) {
        setActionFlag(reg, reentrant_flag);
    }
    if (fed->indexGroup > 0) {
        reg.counter = static_cast<int16_t>(fed->indexGroup);
    }
    addActionMessage(reg);
    // check some properties that should be inherited from the federate if it is the first one
    if (checkProperties) {
        // if this is the first federate then the core should inherit the logging level properties
        for (const auto& prop : info.intProps) {
            switch (prop.first) {
                case defs::Properties::LOG_LEVEL:
                case defs::Properties::FILE_LOG_LEVEL:
                case defs::Properties::CONSOLE_LOG_LEVEL:
                    setIntegerProperty(gLocalCoreId, prop.first, static_cast<int16_t>(prop.second));
                    break;
                default:
                    break;
            }
        }
    }
    // now wait for the federateQueue to get the response
    auto valid = fed->waitSetup();
    if (valid == IterationResult::NEXT_STEP) {
        return local_id;
    }
    throw(RegistrationFailure(std::string("fed received Failure ") + fed->lastErrorString()));
}